

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O0

int DampingFn(long iter,N_Vector u_val,N_Vector g_val,sunrealtype *qt_fn,long depth,void *user_data,
             sunrealtype *damping_factor)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_R8;
  double *in_stack_00000008;
  sunrealtype gain;
  int i_2;
  sunrealtype fn_norm_sqr;
  int i_1;
  sunrealtype fn [3];
  sunrealtype *u_data;
  sunrealtype *g_data;
  long i;
  sunrealtype qt_fn_norm_sqr;
  double local_90;
  int local_7c;
  double local_78;
  int local_6c;
  double adStack_68 [3];
  long local_50;
  long local_48;
  long local_40;
  double local_38;
  undefined8 local_10;
  
  if (in_R8 == 0) {
    *in_stack_00000008 = 0.5;
  }
  else {
    local_38 = 0.0;
    for (local_40 = 0; local_40 < in_R8; local_40 = local_40 + 1) {
      local_38 = *(double *)(in_RCX + local_40 * 8) * *(double *)(in_RCX + local_40 * 8) + local_38;
    }
    local_10 = in_RSI;
    local_48 = N_VGetArrayPointer(in_RDX);
    local_50 = N_VGetArrayPointer(local_10);
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      adStack_68[local_6c] =
           *(double *)(local_48 + (long)local_6c * 8) - *(double *)(local_50 + (long)local_6c * 8);
    }
    local_78 = 0.0;
    for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
      local_78 = adStack_68[local_7c] * adStack_68[local_7c] + local_78;
    }
    if (0.0 < 1.0 - local_38 / local_78) {
      local_90 = sqrt(1.0 - local_38 / local_78);
    }
    else {
      local_90 = 0.0;
    }
    *in_stack_00000008 = local_90 * -0.5 + 0.9;
  }
  return 0;
}

Assistant:

static int DampingFn(long int iter, N_Vector u_val, N_Vector g_val,
                     sunrealtype* qt_fn, long int depth, void* user_data,
                     sunrealtype* damping_factor)
{
  if (depth == 0) { *damping_factor = 0.5; }
  else
  {
    /* Compute ||Q^T fn||^2 */
    sunrealtype qt_fn_norm_sqr = ZERO;
    for (long int i = 0; i < depth; i++)
    {
      qt_fn_norm_sqr += qt_fn[i] * qt_fn[i];
    }

    /* Compute ||fn||^2 = ||G(u_n) - u_n||^2 */
    sunrealtype* g_data = N_VGetArrayPointer(g_val);
    sunrealtype* u_data = N_VGetArrayPointer(u_val);
    sunrealtype fn[3];
    for (int i = 0; i < 3; i++) { fn[i] = g_data[i] - u_data[i]; }
    sunrealtype fn_norm_sqr = ZERO;
    for (int i = 0; i < 3; i++) { fn_norm_sqr += fn[i] * fn[i]; }

    /* Compute the gain = sqrt(1 - ||Q^T fn||^2 / ||fn||^2) */
    sunrealtype gain = SUNRsqrt(ONE - qt_fn_norm_sqr / fn_norm_sqr);

    *damping_factor = 0.9 - 0.5 * gain;
  }

  return 0;
}